

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

void __thiscall
helics::FederateInfo::loadInfoFromArgsIgnoreOutput(FederateInfo *this,int argc,char **argv)

{
  ParseOutput PVar1;
  InvalidParameter *this_00;
  pointer *__ptr;
  string_view message;
  undefined1 local_38 [12];
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  makeCLIApp((FederateInfo *)local_38);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    ((helicsCLI11App *)local_38._0_8_,&argc_local,&argv_local);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,(App *)local_38._0_8_);
    if ((helicsCLI11App *)local_38._0_8_ != (helicsCLI11App *)0x0) {
      (*((App *)local_38._0_8_)->_vptr_App[1])();
    }
    return;
  }
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void FederateInfo::loadInfoFromArgsIgnoreOutput(int argc, char* argv[])
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(argc, argv);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}